

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

bool __thiscall QDir::removeRecursively(QDir *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Permissions PVar4;
  undefined1 uVar5;
  QDirPrivate *this_00;
  long in_FS_OFFSET;
  const_iterator __begin1;
  QDir QStack_88;
  QString local_80;
  DirEntry local_68;
  QDirListing local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QDirPrivate>::detach_helper(&this->d_ptr);
    this_00 = (this->d_ptr).d.ptr;
  }
  bVar1 = QDirPrivate::exists(this_00);
  uVar5 = 1;
  if (bVar1) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::filePath(&local_58,&((this->d_ptr).d.ptr)->dirEntry);
    QDirListing::QDirListing(&local_60,&local_58,(IteratorFlags)0x40);
    local_68.dirListPtr = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_60);
    bVar1 = true;
    for (; local_68.dirListPtr != (QDirListingPrivate *)0x0; local_68 = QDirListing::next(local_68))
    {
      QDirListing::DirEntry::filePath(&local_80,&local_68);
      bVar2 = QDirListing::DirEntry::isDir(&local_68);
      if ((!bVar2) || (bVar2 = QDirListing::DirEntry::isSymLink(&local_68), bVar2)) {
        iVar3 = QFile::remove((char *)&local_80);
        if (((char)iVar3 == '\0') &&
           (((PVar4 = QFile::permissions(&local_80),
             ((uint)PVar4.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                    super_QFlagsStorage<QFileDevice::Permission>.i >> 9 & 1) != 0 ||
             (bVar2 = QFile::setPermissions
                                (&local_80,
                                 (Permissions)
                                 ((uint)PVar4.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                                        super_QFlagsStorage<QFileDevice::Permission>.i | 0x200)),
             !bVar2)) || (iVar3 = QFile::remove((char *)&local_80), (char)iVar3 == '\0'))))
        goto LAB_002272a6;
      }
      else {
        QDir(&QStack_88,&local_80);
        bVar2 = removeRecursively(&QStack_88);
        ~QDir(&QStack_88);
        if (!bVar2) {
LAB_002272a6:
          bVar1 = false;
        }
      }
      if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QDirListing::~QDirListing(&local_60);
    if (bVar1) {
      absolutePath(&local_80,this);
      iVar3 = rmdir(this,(char *)&local_80);
      uVar5 = (undefined1)iVar3;
      if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      uVar5 = 0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar5;
}

Assistant:

bool QDir::removeRecursively()
{
    if (!d_ptr->exists())
        return true;

    bool success = true;
    const QString dirPath = path();
    // not empty -- we must empty it first
    for (const auto &dirEntry : QDirListing(dirPath, QDirListing::IteratorFlag::IncludeHidden)) {
        const QString &filePath = dirEntry.filePath();
        bool ok;
        if (dirEntry.isDir() && !dirEntry.isSymLink()) {
            ok = QDir(filePath).removeRecursively(); // recursive
        } else {
            ok = QFile::remove(filePath);
            if (!ok) { // Read-only files prevent directory deletion on Windows, retry with Write permission.
                const QFile::Permissions permissions = QFile::permissions(filePath);
                if (!(permissions & QFile::WriteUser))
                    ok = QFile::setPermissions(filePath, permissions | QFile::WriteUser)
                        && QFile::remove(filePath);
            }
        }
        if (!ok)
            success = false;
    }

    if (success)
        success = rmdir(absolutePath());

    return success;
}